

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Color(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement_Color *this_00;
  _List_node_base *p_Var6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  runtime_error *this_01;
  uint uVar7;
  ulong uVar8;
  char *__end;
  float fVar9;
  string an;
  string profile;
  string local_a0;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  string local_50;
  
  local_80 = local_70;
  local_78 = (char *)0x0;
  local_70[0] = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar8);
      std::__cxx11::string::string
                ((string *)&local_a0,(char *)CONCAT44(extraout_var,iVar5),(allocator *)&local_50);
      iVar5 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar5 == 0) {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        pcVar3 = local_78;
        strlen((char *)CONCAT44(extraout_var_00,iVar5));
        std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      }
      else {
        Throw_IncorrectAttr(this,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar4 != uVar7);
  }
  this_00 = (CAMFImporter_NodeElement_Color *)operator_new(0x108);
  CAMFImporter_NodeElement_Color::CAMFImporter_NodeElement_Color(this_00,this->mNodeElement_Cur);
  std::__cxx11::string::_M_assign((string *)&this_00->Profile);
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    ParseHelper_Node_Enter(this,(CAMFImporter_NodeElement *)this_00);
    local_54 = 0;
    local_58 = 0;
    local_5c = 0;
    local_60 = 0;
    do {
      do {
        while( true ) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
            Throw_CloseNotFound(this,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            goto LAB_003b4bc1;
          }
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 != 1) break;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"r","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (iVar5 == 0) {
            if ((local_54 & 1) != 0) {
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"r","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_a0,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
            }
            fVar9 = XML_ReadNode_GetVal_AsFloat(this);
            (this_00->Color).r = fVar9;
            local_54 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"g","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            if (iVar5 == 0) {
              if ((local_58 & 1) != 0) {
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"g","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_a0,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
              }
              fVar9 = XML_ReadNode_GetVal_AsFloat(this);
              (this_00->Color).g = fVar9;
              local_58 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"b","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              if (iVar5 == 0) {
                if ((local_5c & 1) != 0) {
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"b","");
                  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_50,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this,&local_a0,&local_50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_50._M_dataplus._M_p != &local_50.field_2) {
                    operator_delete(local_50._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p);
                  }
                }
                fVar9 = XML_ReadNode_GetVal_AsFloat(this);
                (this_00->Color).b = fVar9;
                local_5c = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              else {
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"a","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
                if (iVar5 == 0) {
                  if ((local_60 & 1) != 0) {
                    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"a","");
                    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_50,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_a0,&local_50);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                      operator_delete(local_a0._M_dataplus._M_p);
                    }
                  }
                  fVar9 = XML_ReadNode_GetVal_AsFloat(this);
                  (this_00->Color).a = fVar9;
                  local_60 = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
                }
                else {
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
                  XML_CheckNode_SkipUnsupported(this,&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p);
                  }
                }
              }
            }
          }
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    } while (iVar5 != 0);
LAB_003b4bc1:
    ParseHelper_Node_Exit(this);
    if ((((local_54 & 1) == 0) || ((local_58 & 1) == 0)) || ((local_5c & 1) == 0)) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Not all color components are defined.","");
      std::runtime_error::runtime_error(this_01,(string *)&local_a0);
      *(undefined ***)this_01 = &PTR__runtime_error_008dc448;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_60 & 1) == 0) {
      (this_00->Color).a = 1.0;
    }
  }
  else {
    pCVar2 = this->mNodeElement_Cur;
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  this_00->Composed = false;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Color() {
    std::string profile;
    CAMFImporter_NodeElement* ne;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("profile", profile, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Color(mNodeElement_Cur);

	CAMFImporter_NodeElement_Color& als = *((CAMFImporter_NodeElement_Color*)ne);// alias for convenience

	als.Profile = profile;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[4] = { false, false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("color");
			MACRO_NODECHECK_READCOMP_F("r", read_flag[0], als.Color.r);
			MACRO_NODECHECK_READCOMP_F("g", read_flag[1], als.Color.g);
			MACRO_NODECHECK_READCOMP_F("b", read_flag[2], als.Color.b);
			MACRO_NODECHECK_READCOMP_F("a", read_flag[3], als.Color.a);
		MACRO_NODECHECK_LOOPEND("color");
		ParseHelper_Node_Exit();
		// check that all components was defined
        if (!(read_flag[0] && read_flag[1] && read_flag[2])) {
            throw DeadlyImportError("Not all color components are defined.");
        }

        // check if <a> is absent. Then manually add "a == 1".
        if (!read_flag[3]) {
            als.Color.a = 1;
        }
	}
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}

	als.Composed = false;
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}